

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_to_uint32_array(void *vout,run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  ushort uVar2;
  int local_38;
  uint32_t val;
  int j;
  int iStack_2c;
  uint16_t le;
  uint32_t run_start;
  int i;
  uint32_t *out;
  int outpos;
  uint32_t base_local;
  run_container_t *cont_local;
  void *vout_local;
  
  out._0_4_ = 0;
  for (iStack_2c = 0; iStack_2c < cont->n_runs; iStack_2c = iStack_2c + 1) {
    uVar1 = cont->runs[iStack_2c].value;
    uVar2 = cont->runs[iStack_2c].length;
    for (local_38 = 0; local_38 <= (int)(uint)uVar2; local_38 = local_38 + 1) {
      *(uint32_t *)((long)vout + (long)(int)out * 4) = base + uVar1 + local_38;
      out._0_4_ = (int)out + 1;
    }
  }
  return (int)out;
}

Assistant:

int run_container_to_uint32_array(void *vout, const run_container_t *cont,
                                  uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (int j = 0; j <= le; ++j) {
            uint32_t val = run_start + j;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
        }
    }
    return outpos;
}